

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O2

int archive_write_open(archive *_a,void *client_data,undefined1 *opener,
                      archive_write_callback *writer,undefined1 *closer)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  archive_write_filter *paVar4;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_open");
  if (iVar2 == -0x1e) {
    iVar2 = -0x1e;
  }
  else {
    archive_clear_error(_a);
    *(archive_write_callback **)&_a[1].file_count = writer;
    _a[1].compression_name = opener;
    _a[1].error = closer;
    _a[1].error_string.s = (char *)client_data;
    paVar4 = __archive_write_allocate_filter(_a);
    paVar4->open = archive_write_client_open;
    paVar4->write = archive_write_client_write;
    paVar4->close = archive_write_client_close;
    pcVar1 = *(code **)(_a[1].error_string.buffer_length + 0x20);
    if (pcVar1 == (code *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*pcVar1)();
      if (iVar2 < -0x14) {
        iVar3 = __archive_write_close_filter
                          ((archive_write_filter *)_a[1].error_string.buffer_length);
        if (iVar3 < iVar2) {
          return iVar3;
        }
        return iVar2;
      }
    }
    _a->state = 2;
    if (*(code **)(_a + 2) != (code *)0x0) {
      iVar2 = (**(code **)(_a + 2))(_a);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_open(struct archive *_a, void *client_data,
    archive_open_callback *opener, archive_write_callback *writer,
    archive_close_callback *closer)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *client_filter;
	int ret, r1;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_open");
	archive_clear_error(&a->archive);

	a->client_writer = writer;
	a->client_opener = opener;
	a->client_closer = closer;
	a->client_data = client_data;

	client_filter = __archive_write_allocate_filter(_a);
	client_filter->open = archive_write_client_open;
	client_filter->write = archive_write_client_write;
	client_filter->close = archive_write_client_close;

	ret = __archive_write_open_filter(a->filter_first);
	if (ret < ARCHIVE_WARN) {
		r1 = __archive_write_close_filter(a->filter_first);
		return (r1 < ret ? r1 : ret);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;
	if (a->format_init)
		ret = (a->format_init)(a);
	return (ret);
}